

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_connect_selection(_glist *x)

{
  int in1;
  int out2;
  int out1;
  int out0;
  int out0_00;
  int out1_00;
  int out2_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _selection *p_Var6;
  t_object *ptVar7;
  t_object *ptVar8;
  t_object *ptVar9;
  _outconnect *p_Var10;
  char *name;
  uint uVar11;
  t_gobj *x_00;
  t_gobj *ptVar12;
  int iVar13;
  t_object *obj0;
  t_object *obj2;
  t_gobj *x_01;
  t_float index1;
  t_float index2;
  int in21;
  int in20;
  int in12;
  int in10;
  int in02;
  int in01;
  int out21;
  int out20;
  int out12;
  int out10;
  int out02;
  t_linetraverser t;
  
  if (x->gl_editor == (t_editor *)0x0) {
    p_Var6 = (t_selection *)0x0;
  }
  else {
    p_Var6 = x->gl_editor->e_selection;
  }
  if (p_Var6 == (t_selection *)0x0) {
    ptVar12 = (t_gobj *)0x0;
    x_01 = (t_gobj *)0x0;
    x_00 = (t_gobj *)0x0;
  }
  else {
    x_00 = (t_gobj *)0x0;
    x_01 = (t_gobj *)0x0;
    ptVar12 = (t_gobj *)0x0;
    do {
      if (x_00 == (t_gobj *)0x0) {
        x_00 = p_Var6->sel_what;
      }
      else if (x_01 == (t_gobj *)0x0) {
        x_01 = p_Var6->sel_what;
      }
      else {
        if (ptVar12 != (t_gobj *)0x0) {
          return;
        }
        ptVar12 = p_Var6->sel_what;
      }
      p_Var6 = p_Var6->sel_next;
    } while (p_Var6 != (_selection *)0x0);
  }
  if (x_00 == (t_gobj *)0x0) {
    return;
  }
  if (x_01 == (t_gobj *)0x0) {
    ptVar7 = pd_checkobject(&x_00->g_pd);
    if (ptVar7 == (t_object *)0x0) {
      return;
    }
    if ((x->gl_editor->field_0x88 & 0x20) != 0) {
      ptVar12 = x->gl_list;
      if (ptVar12 != (t_gobj *)0x0) {
        iVar1 = x->gl_editor->e_selectline_index1 + 1;
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) goto LAB_00145003;
          ptVar12 = ptVar12->g_next;
        } while (ptVar12 != (_gobj *)0x0);
      }
      ptVar12 = (t_gobj *)0x0;
LAB_00145003:
      if (ptVar12 == (t_gobj *)0x0) {
        ptVar8 = (t_object *)0x0;
      }
      else {
        ptVar8 = pd_checkobject(&ptVar12->g_pd);
      }
      ptVar12 = x->gl_list;
      if (ptVar12 != (t_gobj *)0x0) {
        iVar1 = x->gl_editor->e_selectline_index2 + 1;
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) goto LAB_00145039;
          ptVar12 = ptVar12->g_next;
        } while (ptVar12 != (_gobj *)0x0);
      }
      ptVar12 = (t_gobj *)0x0;
LAB_00145039:
      if (ptVar12 == (t_gobj *)0x0) {
        ptVar9 = (t_object *)0x0;
      }
      else {
        ptVar9 = pd_checkobject(&ptVar12->g_pd);
      }
      iVar1 = canconnect(x,ptVar8,x->gl_editor->e_selectline_outno,ptVar7,0);
      if (iVar1 == 0) {
        return;
      }
      iVar1 = canconnect(x,ptVar7,0,ptVar9,x->gl_editor->e_selectline_inno);
      if (iVar1 == 0) {
        return;
      }
      canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
      tryconnect(x,ptVar8,x->gl_editor->e_selectline_outno,ptVar7,0);
      tryconnect(x,ptVar7,0,ptVar9,x->gl_editor->e_selectline_inno);
      canvas_clearline(x);
      canvas_undo_add(x,UNDO_SEQUENCE_END,"reconnect",(void *)0x0);
      return;
    }
    canvas_undo_add(x,UNDO_SEQUENCE_START,"disconnect",(void *)0x0);
    linetraverser_start(&t,x);
    p_Var10 = linetraverser_next(&t);
    if (p_Var10 != (_outconnect *)0x0) {
      do {
        if (ptVar7 == t.tr_ob2 || ptVar7 == t.tr_ob) {
          ptVar8 = (t_object *)x->gl_list;
          index2 = 0.0;
          index1 = 0.0;
          if (ptVar8 != t.tr_ob && ptVar8 != (t_object *)0x0) {
            iVar1 = 0;
            ptVar9 = ptVar8;
            do {
              iVar1 = iVar1 + 1;
              ptVar9 = (t_object *)(ptVar9->te_g).g_next;
              if (ptVar9 == (t_object *)0x0) break;
            } while (ptVar9 != t.tr_ob);
            index1 = (t_float)iVar1;
          }
          if (ptVar8 != t.tr_ob2 && ptVar8 != (t_object *)0x0) {
            iVar1 = 0;
            do {
              iVar1 = iVar1 + 1;
              ptVar8 = (t_object *)(ptVar8->te_g).g_next;
              if (ptVar8 == (t_object *)0x0) break;
            } while (ptVar8 != t.tr_ob2);
            index2 = (t_float)iVar1;
          }
          canvas_disconnect_with_undo(x,index1,(float)t.tr_outno,index2,(float)t.tr_inno);
        }
        p_Var10 = linetraverser_next(&t);
      } while (p_Var10 != (_outconnect *)0x0);
    }
    name = "disconnect";
  }
  else {
    ptVar7 = pd_checkobject(&x_00->g_pd);
    if (ptVar12 == (t_gobj *)0x0) {
      if (ptVar7 == (t_object *)0x0) {
        return;
      }
      ptVar8 = pd_checkobject(&x_01->g_pd);
      if (ptVar8 == (t_object *)0x0) {
        return;
      }
      ptVar9 = ptVar7;
      if (ptVar8->te_ypix < ptVar7->te_ypix) {
        ptVar9 = ptVar8;
        ptVar8 = ptVar7;
      }
      iVar1 = obj_noutlets(ptVar9);
      if (iVar1 == 0) {
        return;
      }
      iVar1 = obj_noutlets(ptVar9);
      iVar3 = obj_ninlets(ptVar8);
      uVar11 = 1;
      if (iVar1 == 1) {
        iVar4 = obj_issignaloutlet(ptVar9,0);
        uVar11 = (uint)(iVar4 == 0);
      }
      iVar13 = 0;
      iVar4 = tryconnect(x,ptVar9,0,ptVar8,0);
      if (iVar4 != 0) {
        return;
      }
      iVar4 = 1;
      while( true ) {
        if (iVar1 <= iVar13) {
          return;
        }
        if (iVar3 <= iVar4 + -1) break;
        iVar13 = iVar13 + uVar11;
        iVar5 = tryconnect(x,ptVar9,iVar13,ptVar8,iVar4);
        iVar4 = iVar4 + 1;
        if (iVar5 != 0) {
          return;
        }
      }
      return;
    }
    if (ptVar7 == (t_object *)0x0) {
      return;
    }
    ptVar8 = pd_checkobject(&x_01->g_pd);
    if (ptVar8 == (t_object *)0x0) {
      return;
    }
    ptVar9 = pd_checkobject(&ptVar12->g_pd);
    if (ptVar7 == ptVar8) {
      return;
    }
    if (ptVar8 == ptVar9) {
      return;
    }
    if (ptVar9 == (t_object *)0x0) {
      return;
    }
    if (ptVar7 == ptVar9) {
      return;
    }
    iVar1 = canvas_getconns(ptVar7,(int *)&t,ptVar9,&in10);
    if (iVar1 != 1) {
      in10 = -1;
      t.tr_x._0_4_ = -1;
    }
    iVar1 = canvas_getconns(ptVar7,&out02,ptVar8,&in20);
    if (iVar1 != 1) {
      in20 = -1;
      out02 = -1;
    }
    iVar1 = canvas_getconns(ptVar9,&out10,ptVar7,&in01);
    if (iVar1 != 1) {
      in01 = -1;
      out10 = -1;
    }
    iVar1 = canvas_getconns(ptVar9,&out12,ptVar8,&in21);
    if (iVar1 != 1) {
      in21 = -1;
      out12 = -1;
    }
    iVar1 = canvas_getconns(ptVar8,&out20,ptVar7,&in02);
    if (iVar1 != 1) {
      in02 = -1;
      out20 = -1;
    }
    iVar1 = canvas_getconns(ptVar8,&out21,ptVar9,&in12);
    if (iVar1 != 1) {
      in12 = -1;
      out21 = -1;
    }
    canvas_undo_add(x,UNDO_SEQUENCE_START,"reconnect",(void *)0x0);
    out2_00 = (int)t.tr_x;
    out0 = out12;
    out1 = out20;
    iVar5 = in02;
    iVar13 = in10;
    iVar1 = in21;
    iVar2 = canvas_try_bypassobj1(x,ptVar7,in02,(int)t.tr_x,ptVar9,in10,out12,ptVar8,in21,out20);
    out1_00 = out02;
    out0_00 = out10;
    out2 = out21;
    in1 = in01;
    iVar4 = in12;
    iVar3 = in20;
    if ((((((iVar2 == 0) &&
           (iVar2 = canvas_try_bypassobj1(x,ptVar7,in01,out02,ptVar8,in20,out21,ptVar9,in12,out10),
           iVar2 == 0)) &&
          (iVar2 = canvas_try_bypassobj1
                             (x,ptVar9,iVar4,out0_00,ptVar7,in1,out1_00,ptVar8,iVar3,out2),
          iVar2 == 0)) &&
         ((iVar2 = canvas_try_bypassobj1
                             (x,ptVar9,iVar13,out0,ptVar8,iVar1,out1,ptVar7,iVar5,out2_00),
          iVar2 == 0 &&
          (iVar2 = canvas_try_bypassobj1
                             (x,ptVar8,iVar1,out1,ptVar7,iVar5,out2_00,ptVar9,iVar13,out0),
          iVar2 == 0)))) &&
        ((iVar2 = canvas_try_bypassobj1(x,ptVar8,iVar3,out2,ptVar9,iVar4,out0_00,ptVar7,in1,out1_00)
         , iVar2 == 0 &&
         ((iVar2 = canvas_try_insert(x,ptVar7,iVar5,out2_00,ptVar9,iVar13,out0,ptVar8,iVar1,out1),
          iVar2 == 0 &&
          (iVar2 = canvas_try_insert(x,ptVar7,in1,out1_00,ptVar8,iVar3,out2,ptVar9,iVar4,out0_00),
          iVar2 == 0)))))) &&
       ((iVar2 = canvas_try_insert(x,ptVar9,iVar4,out0_00,ptVar7,in1,out1_00,ptVar8,iVar3,out2),
        iVar2 == 0 &&
        ((iVar2 = canvas_try_insert(x,ptVar9,iVar13,out0,ptVar8,iVar1,out1,ptVar7,iVar5,out2_00),
         iVar2 == 0 &&
         (iVar1 = canvas_try_insert(x,ptVar8,iVar1,out1,ptVar7,iVar5,out2_00,ptVar9,iVar13,out0),
         iVar1 == 0)))))) {
      canvas_try_insert(x,ptVar8,iVar3,out2,ptVar9,iVar4,out0_00,ptVar7,in1,out1_00);
    }
    name = "reconnect";
  }
  canvas_undo_add(x,UNDO_SEQUENCE_END,name,(void *)0x0);
  return;
}

Assistant:

static void canvas_connect_selection(t_canvas *x)
{
    t_gobj *a, *b, *c;
    t_selection *sel;
    t_object *objsrc, *objsink;

    a = b = c = NULL;
    sel = x->gl_editor ? x->gl_editor->e_selection : NULL;
    for (; sel; sel = sel->sel_next)
    {
        if (!a)
            a = sel->sel_what;
        else if (!b)
            b = sel->sel_what;
        else if (!c)
            c = sel->sel_what;
        else
            return;
    }

    if(!a)
        return;

    if(!b)
    {
            /* only a single object is selected.
             * if a connection is selected, insert the object
             * if no connection is selected, disconnect the object
             */
        t_object*obj = pd_checkobject(&a->g_pd);
        if(!obj)
            return;
        if(x->gl_editor->e_selectedline)
        {
            b = glist_nth(x, x->gl_editor->e_selectline_index1);
            objsrc = b?pd_checkobject(&b->g_pd):0;
            b = glist_nth(x, x->gl_editor->e_selectline_index2);
            objsink = b?pd_checkobject(&b->g_pd):0;

            if(canconnect(x, objsrc, x->gl_editor->e_selectline_outno, obj, 0)
               && canconnect(x, obj, 0, objsink, x->gl_editor->e_selectline_inno))
            {
                canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
                tryconnect(x, objsrc, x->gl_editor->e_selectline_outno, obj, 0);
                tryconnect(x, obj, 0, objsink, x->gl_editor->e_selectline_inno);
                canvas_clearline(x);
                canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);
            }
        }
        else
        {
                /* disconnect the entire object */
            t_linetraverser t;
            t_outconnect *oc;
            canvas_undo_add(x, UNDO_SEQUENCE_START, "disconnect", 0);
            linetraverser_start(&t, x);
            while ((oc = linetraverser_next(&t)))
            {
                if ((obj == t.tr_ob) || (obj == t.tr_ob2))
                {
                    int srcno = glist_getindex(x, &t.tr_ob->ob_g);
                    int sinkno = glist_getindex(x, &t.tr_ob2->ob_g);
                    canvas_disconnect_with_undo(x, srcno, t.tr_outno, sinkno, t.tr_inno);
                }
            }
            canvas_undo_add(x, UNDO_SEQUENCE_END, "disconnect", 0);
        }
            /* need to return since we have touched 'b' */
        return;
    }

    if(!c)
    {
            /* exactly two objects are selected
             * connect them (top to bottom) if they are patchable
             */
        if (!(objsrc = pd_checkobject(&a->g_pd)) ||
            !(objsink = pd_checkobject(&b->g_pd)))
            return;

        if(objsink->te_ypix < objsrc->te_ypix)
        {
            t_object*obj = objsink;
            objsink = objsrc;
            objsrc = obj;
        }
        if (!objsrc || !objsink)
            return;
        if (obj_noutlets(objsrc))
        {
            int noutlets = obj_noutlets(objsrc);
            int ninlets = obj_ninlets(objsink);
            int fanout = (noutlets == 1) && obj_issignaloutlet(objsrc, 0);
            int out = 0, in = 0;
            while(!tryconnect(x, objsrc, out, objsink, in))
            {
                if (noutlets <= out)
                    return;
                if (ninlets <= in )
                    return;
                in++;
                if(!fanout)
                    out++;
            }
        }
        return;
    }

        /* exactly three objects are selected
         * if they are chained up, unconnect the middle object, and connect the source to the sink
         * if only two of them are connected, insert the third
         */
    if ((objsrc = pd_checkobject(&a->g_pd)) &&
        (objsink = pd_checkobject(&b->g_pd)))
    {
        t_object *obj0 = objsrc, *obj2 = objsink;
        t_object *obj1 = pd_checkobject(&c->g_pd);
        int out01, out02, out10, out12, out20, out21;
        int in01, in02, in10, in12, in20, in21;
        if(!obj1
           || (obj0 == obj1)
           || (obj2 == obj1)
           || (obj0 == obj2))
            return;
#define GET1CONN(a, b) \
        if (1 != canvas_getconns(obj##a, &out##a##b, obj##b, &in##b##a)) \
            out##a##b = in##b##a = -1
        GET1CONN(0, 1);
        GET1CONN(0, 2);
        GET1CONN(1, 0);
        GET1CONN(1, 2);
        GET1CONN(2, 0);
        GET1CONN(2, 1);
#define TRYCONNCHANGE(fun, a, b, c)                                      \
        canvas_try_##fun(x, obj##a, in##a##c, out##a##b, obj##b, in##b##a, out##b##c, obj##c, in##c##b, out##c##a)

        canvas_undo_add(x, UNDO_SEQUENCE_START, "reconnect", 0);
        0
            || TRYCONNCHANGE(bypassobj1, 0, 1, 2)
            || TRYCONNCHANGE(bypassobj1, 0, 2, 1)
            || TRYCONNCHANGE(bypassobj1, 1, 0, 2)
            || TRYCONNCHANGE(bypassobj1, 1, 2, 0)
            || TRYCONNCHANGE(bypassobj1, 2, 0, 1)
            || TRYCONNCHANGE(bypassobj1, 2, 1, 0)
            || TRYCONNCHANGE(insert,     0, 1, 2)
            || TRYCONNCHANGE(insert,     0, 2, 1)
            || TRYCONNCHANGE(insert,     1, 0, 2)
            || TRYCONNCHANGE(insert,     1, 2, 0)
            || TRYCONNCHANGE(insert,     2, 0, 1)
            || TRYCONNCHANGE(insert,     2, 1, 0)
            ;
        canvas_undo_add(x, UNDO_SEQUENCE_END, "reconnect", 0);
    }
}